

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

void __thiscall
Saturation::SaturationAlgorithm::onClauseReduction
          (SaturationAlgorithm *this,Clause *cl,Clause **replacements,uint numOfReplacements,
          Clause *premise,bool forward)

{
  SingletonIterator<Kernel::Clause_*> it;
  ClauseIterator premises;
  VirtualIterator<Kernel::Clause_*> local_48;
  ClauseIterator local_40;
  VirtualIterator<Kernel::Clause_*> local_38;
  
  local_48._core = (IteratorCore<Kernel::Clause_*> *)0x0;
  if (premise == (Clause *)0x0) {
    Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
  }
  else {
    it._el = (Clause *)0x0;
    it._0_8_ = &local_38;
    Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(it);
  }
  Lib::VirtualIterator<Kernel::Clause_*>::operator=(&local_48,&local_38);
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&local_38);
  local_40._core = local_48._core;
  if (local_48._core != (IteratorCore<Kernel::Clause_*> *)0x0) {
    (local_48._core)->_refCnt = (local_48._core)->_refCnt + 1;
  }
  onClauseReduction(this,cl,replacements,numOfReplacements,&local_40,forward);
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&local_40);
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&local_48);
  return;
}

Assistant:

void SaturationAlgorithm::onClauseReduction(Clause* cl, Clause **replacements, unsigned numOfReplacements,
                                            Clause* premise, bool forward)
{
  ASS(cl);

  ClauseIterator premises;

  if (premise) {
    premises = pvi(getSingletonIterator(premise));
  }
  else {
    premises = ClauseIterator::getEmpty();
  }

  onClauseReduction(cl, replacements, numOfReplacements, premises, forward);
}